

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O3

UINT32 NES_DMC_np_Render(void *chip,INT32 *b)

{
  short sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  short sVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  int local_3c [3];
  
  uVar17 = *(long *)((long)chip + 0x40120) + *(long *)((long)chip + 0x40118);
  *(ulong *)((long)chip + 0x40120) = uVar17 & 0xffffffff;
  iVar16 = (int)(uVar17 >> 0x20);
  iVar2 = *(int *)((long)chip + 0x40100) + iVar16;
  *(int *)((long)chip + 0x40100) = iVar2;
  if (*(int *)((long)chip + 0x40104) < iVar2) {
    iVar2 = *(int *)((long)chip + 0x40108);
    do {
      FrameSequence((NES_DMC *)chip,iVar2);
      iVar3 = *(int *)((long)chip + 0x40100) - *(int *)((long)chip + 0x40104);
      *(int *)((long)chip + 0x40100) = iVar3;
      iVar2 = *(int *)((long)chip + 0x40108) + 1;
      if (*(int *)((long)chip + 0x4010c) <= iVar2) {
        iVar2 = 0;
      }
      *(int *)((long)chip + 0x40108) = iVar2;
    } while (*(int *)((long)chip + 0x40104) < iVar3);
  }
  if (((*(int *)((long)chip + 0x400c4) < 1) || (*(int *)((long)chip + 0x400f0) < 1)) ||
     (uVar4 = *(uint *)((long)chip + 0x400c0), *(int *)((long)chip + 0x40020) != 0 && uVar4 == 0)) {
    if ((*(int *)((long)chip + 0x40024) != 0) &&
       (uVar4 = *(uint *)((long)chip + 0x400b4), (int)uVar4 < 0x1f && uVar4 != 0)) {
      uVar8 = *(int *)((long)chip + 0x400a8) + iVar16;
      uVar5 = *(uint *)((long)chip + 0x400c0);
      if (uVar5 < uVar8) {
        do {
          if (uVar4 == 0) break;
          uVar4 = uVar4 + 1 & 0x1f;
          *(uint *)((long)chip + 0x400b4) = uVar4;
          uVar8 = uVar8 + ~uVar5;
        } while (uVar5 < uVar8);
      }
      *(uint *)((long)chip + 0x400a8) = uVar8;
    }
  }
  else {
    uVar5 = *(int *)((long)chip + 0x400a8) + iVar16;
    if (uVar4 < uVar5) {
      uVar8 = *(uint *)((long)chip + 0x400b4);
      do {
        uVar5 = uVar5 + ~uVar4;
        uVar8 = uVar8 + 1 & 0x1f;
      } while (uVar4 < uVar5);
      *(uint *)((long)chip + 0x400b4) = uVar8;
    }
    *(uint *)((long)chip + 0x400a8) = uVar5;
  }
  uVar4 = *(uint *)(calc_tri_tritbl + (long)*(int *)((long)chip + 0x400b4) * 4);
  *(uint *)((long)chip + 0x40068) = uVar4;
  puVar7 = (uint *)((long)chip + 0x400d0);
  if (*(char *)((long)chip + 0x400dd) == '\0') {
    puVar7 = (uint *)((long)chip + 0x400e8);
  }
  uVar5 = 0;
  if (0 < *(int *)((long)chip + 0x400f4)) {
    uVar5 = *puVar7;
  }
  uVar8 = *(uint *)((long)chip + 0x400d4);
  uVar6 = (int)(uVar8 << 0x11) >> 0x1f & uVar5;
  if (uVar17 >> 0x20 != 0) {
    iVar2 = *(int *)((long)chip + 0x400ac);
    uVar12 = *(uint *)((long)chip + 0x400b8);
    *(int *)((long)chip + 0x400ac) = iVar2 + iVar16;
    if (uVar12 - 1 < (uint)(iVar2 + iVar16)) {
      uVar13 = 0;
      iVar3 = 0;
      iVar15 = 0;
      do {
        uVar8 = ((uint)((uVar8 & *(uint *)((long)chip + 0x400d8)) != 0) ^ uVar8 & 1) << 0xe |
                uVar8 >> 1;
        iVar15 = iVar15 + 1;
        iVar3 = iVar3 + uVar6;
        uVar6 = (int)(uVar8 << 0x11) >> 0x1f & uVar5;
        uVar13 = uVar13 + iVar16;
        iVar2 = iVar2 - uVar12;
        uVar9 = iVar16 + iVar2;
      } while (uVar12 <= uVar9);
      *(uint *)((long)chip + 0x400d4) = uVar8;
      *(uint *)((long)chip + 0x400ac) = uVar9;
      if (iVar15 != 0) {
        uVar6 = (uVar9 * iVar15 * uVar6 - iVar2 * iVar3) / uVar13;
      }
    }
  }
  *(uint *)((long)chip + 0x4006c) = uVar6;
  uVar5 = *(uint *)((long)chip + 0x400bc);
  uVar8 = *(int *)((long)chip + 0x400b0) + iVar16;
  *(uint *)((long)chip + 0x400b0) = uVar8;
  if (uVar5 - 1 < uVar8) {
    iVar2 = *(int *)((long)chip + 0x40078);
    uVar12 = *(uint *)((long)chip + 0x4007c);
    do {
      if (uVar12 == 0x100) {
LAB_0016319a:
        if (*(char *)((long)chip + 0x400a5) == '\0') {
          uVar12 = 0x100;
          goto LAB_001631ff;
        }
        uVar12 = *(byte *)(*(long *)((long)chip + 0x40060) + (ulong)*(uint *)((long)chip + 0x40074))
                 | 0x10000;
        *(uint *)((long)chip + 0x4007c) = uVar12;
        if (iVar2 != 0) {
          *(uint *)((long)chip + 0x40074) = *(uint *)((long)chip + 0x40074) + 1 & 0xffff | 0x8000;
          iVar2 = iVar2 + -1;
          *(int *)((long)chip + 0x40078) = iVar2;
          goto LAB_001631ff;
        }
LAB_00163204:
        if ((*(uint *)((long)chip + 0x400a0) & 1) == 0) {
          iVar2 = 0;
          bVar18 = false;
          if (*(uint *)((long)chip + 0x400a0) == 2) {
            bVar18 = *(char *)((long)chip + 0x400a5) != '\0';
          }
          *(bool *)((long)chip + 0x400a4) = bVar18;
          *(undefined1 *)((long)chip + 0x400a5) = 0;
        }
        else {
          *(uint *)((long)chip + 0x40074) = *(int *)((long)chip + 0x40058) << 6 | 0xc000;
          iVar2 = *(int *)((long)chip + 0x40054) * 0x10 + 1;
          *(int *)((long)chip + 0x40078) = iVar2;
        }
      }
      else {
        sVar1 = *(short *)((long)chip + 0x40080);
        if ((uVar12 & 1) == 0) {
          sVar14 = -1;
          if (0 < sVar1) {
LAB_00163178:
            *(short *)((long)chip + 0x40080) = sVar14 + sVar1;
          }
        }
        else {
          sVar14 = 1;
          if (sVar1 < 0x3f) goto LAB_00163178;
        }
        uVar12 = uVar12 >> 1;
        *(uint *)((long)chip + 0x4007c) = uVar12;
        if (uVar12 == 0x100) goto LAB_0016319a;
LAB_001631ff:
        if (iVar2 == 0) goto LAB_00163204;
      }
      iVar16 = uVar8 - uVar5;
      uVar8 = uVar8 - uVar5;
      *(int *)((long)chip + 0x400b0) = iVar16;
    } while (uVar5 <= uVar8);
  }
  uVar5 = *(uint *)((long)chip + 0x40028);
  uVar8 = 0;
  if ((uVar5 & 1) != 0) {
    uVar4 = uVar8;
  }
  if ((uVar5 & 2) != 0) {
    uVar6 = uVar8;
  }
  *(uint *)((long)chip + 0x40068) = uVar4;
  uVar12 = *(short *)((long)chip + 0x40080) * 2 + *(int *)((long)chip + 0x40084);
  if ((uVar5 & 4) != 0) {
    uVar12 = uVar8;
  }
  *(uint *)((long)chip + 0x4006c) = uVar6;
  *(uint *)((long)chip + 0x40070) = uVar12;
  local_3c[0] = *(int *)((long)chip + (ulong)uVar4 * 0x2000 + 8);
  local_3c[1] = *(int *)((long)chip + (ulong)uVar6 * 0x200 + 8);
  local_3c[2] = *(int *)((long)chip + (ulong)uVar12 * 4 + 8);
  iVar2 = local_3c[0];
  iVar16 = local_3c[1];
  iVar3 = local_3c[2];
  if (*(int *)((long)chip + 0x4000c) != 0) {
    iVar15 = *(int *)((long)chip +
                     (ulong)uVar12 * 4 + (ulong)uVar6 * 0x200 + (ulong)uVar4 * 0x2000 + 0x20008);
    iVar11 = local_3c[1] + local_3c[0] + local_3c[2];
    iVar2 = iVar15;
    iVar16 = iVar15;
    iVar3 = iVar15;
    if (iVar11 != 0) {
      lVar10 = 0;
      do {
        local_3c[lVar10] = (local_3c[lVar10] * iVar15) / iVar11;
        lVar10 = lVar10 + 1;
        iVar2 = local_3c[0];
        iVar16 = local_3c[1];
        iVar3 = local_3c[2];
      } while (lVar10 != 3);
    }
  }
  local_3c[2] = iVar3;
  local_3c[1] = iVar16;
  local_3c[0] = iVar2;
  if (*(int *)((long)chip + 0x40018) == 0) goto LAB_001633d0;
  if (*(char *)((long)chip + 0x40088) == '\0') {
    iVar2 = *(int *)((long)chip + 0x4008c);
LAB_001633b2:
    *(int *)((long)chip + 0x40090) = local_3c[2];
    local_3c[2] = local_3c[2] + iVar2;
    if (0 < iVar2) goto LAB_001633c6;
    if (-1 < iVar2) goto LAB_001633d0;
LAB_001633cc:
    iVar2 = iVar2 + 1;
  }
  else {
    iVar2 = (*(int *)((long)chip + 0x40090) - local_3c[2]) + *(int *)((long)chip + 0x4008c);
    *(int *)((long)chip + 0x4008c) = iVar2;
    *(undefined1 *)((long)chip + 0x40088) = 0;
    if (iVar2 < 0x3ffc0001) {
      if (-0x3ffc0001 < iVar2) goto LAB_001633b2;
      *(int *)((long)chip + 0x40090) = local_3c[2];
      local_3c[2] = local_3c[2] + -0x3ffc0000;
      iVar2 = -0x3ffc0000;
      goto LAB_001633cc;
    }
    *(int *)((long)chip + 0x40090) = local_3c[2];
    local_3c[2] = local_3c[2] + 0x3ffc0000;
    iVar2 = 0x3ffc0000;
LAB_001633c6:
    iVar2 = iVar2 + -1;
  }
  *(int *)((long)chip + 0x4008c) = iVar2;
LAB_001633d0:
  iVar2 = *(int *)((long)chip + 0x4002c) * local_3c[0];
  *b = iVar2;
  iVar2 = *(int *)((long)chip + 0x40030) * local_3c[1] + iVar2;
  *b = iVar2;
  *b = iVar2 - *(int *)((long)chip + 0x40034) * local_3c[2] >> 5;
  local_3c[0] = local_3c[0] * *(int *)((long)chip + 0x40038);
  b[1] = local_3c[0];
  local_3c[0] = local_3c[1] * *(int *)((long)chip + 0x4003c) + local_3c[0];
  b[1] = local_3c[0];
  b[1] = local_3c[0] - local_3c[2] * *(int *)((long)chip + 0x40040) >> 5;
  return 2;
}

Assistant:

UINT32 NES_DMC_np_Render(void* chip, INT32 b[2])
{
	NES_DMC* dmc = (NES_DMC*)chip;
	UINT32 clocks;
	INT32 m[3];

	RC_STEP(&dmc->tick_count);
	clocks = RC_GET_VAL(&dmc->tick_count);
	RC_MASK(&dmc->tick_count);
	TickFrameSequence(dmc, clocks);
	Tick(dmc, clocks);

	dmc->out[0] = (dmc->mask & 1) ? 0 : dmc->out[0];
	dmc->out[1] = (dmc->mask & 2) ? 0 : dmc->out[1];
	dmc->out[2] = (dmc->mask & 4) ? 0 : dmc->out[2];

	m[0] = dmc->tnd_table[0][dmc->out[0]][0][0];
	m[1] = dmc->tnd_table[0][0][dmc->out[1]][0];
	m[2] = dmc->tnd_table[0][0][0][dmc->out[2]];

	if (dmc->option[OPT_NONLINEAR_MIXER])
	{
		INT32 ref = m[0] + m[1] + m[2];
		INT32 voltage = dmc->tnd_table[1][dmc->out[0]][dmc->out[1]][dmc->out[2]];
		int i;
		if (ref)
		{
			for (i=0; i < 3; ++i)
				m[i] = (m[i] * voltage) / ref;
		}
		else
		{
			for (i=0; i < 3; ++i)
				m[i] = voltage;
		}
	}

	// anti-click nullifies any 4011 write but preserves nonlinearity
	if (dmc->option[OPT_DPCM_ANTI_CLICK])
	{
		if (dmc->dmc_pop) // $4011 will cause pop this frame
		{
			// adjust offset to counteract pop
			dmc->dmc_pop_offset += dmc->dmc_pop_follow - m[2];
			dmc->dmc_pop = false;

			// prevent overflow, keep headspace at edges
			//const INT32 OFFSET_MAX = (1 << 30) - (4 << 16);
#define OFFSET_MAX	((1 << 30) - (4 << 16))
			if (dmc->dmc_pop_offset >  OFFSET_MAX) dmc->dmc_pop_offset =  OFFSET_MAX;
			if (dmc->dmc_pop_offset < -OFFSET_MAX) dmc->dmc_pop_offset = -OFFSET_MAX;
		}
		dmc->dmc_pop_follow = m[2]; // remember previous position

		m[2] += dmc->dmc_pop_offset; // apply offset

		// TODO implement this in a better way
		// roll off offset (not ideal, but prevents overflow)
		if (dmc->dmc_pop_offset > 0) --dmc->dmc_pop_offset;
		else if (dmc->dmc_pop_offset < 0) ++dmc->dmc_pop_offset;
	}

	b[0]  = m[0] * dmc->sm[0][0];
	b[0] += m[1] * dmc->sm[0][1];
	b[0] +=-m[2] * dmc->sm[0][2];
	b[0] >>= 7-2;

	b[1]  = m[0] * dmc->sm[1][0];
	b[1] += m[1] * dmc->sm[1][1];
	b[1] +=-m[2] * dmc->sm[1][2];
	b[1] >>= 7-2;

	return 2;
}